

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

void xmlXIncludeBaseFixup
               (xmlXIncludeCtxtPtr ctxt,xmlNodePtr cur,xmlNodePtr copy,xmlChar *targetBase)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *base;
  xmlChar *relBase;
  xmlNs ns;
  xmlChar *local_68;
  xmlChar *local_60;
  xmlNs local_58;
  
  local_68 = (xmlChar *)0x0;
  local_60 = (xmlChar *)0x0;
  if (cur->type != XML_ELEMENT_NODE) {
    return;
  }
  iVar1 = xmlNodeGetBaseSafe(cur->doc,cur,&local_68);
  if (iVar1 < 0) {
    ctxt->fatalErr = 1;
    ctxt->errNo = 2;
    ctxt->nbErrors = ctxt->nbErrors + 1;
    xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                        (xmlError *)0x0);
  }
  if ((local_68 == (xmlChar *)0x0) || (iVar1 = xmlStrEqual(local_68,targetBase), iVar1 != 0)) {
LAB_001b7d6a:
    local_58.prefix = (xmlChar *)0x0;
    local_58._private = (void *)0x0;
    local_58.context = (_xmlDoc *)0x0;
    local_58.next = (_xmlNs *)0x0;
    local_58.type = 0;
    local_58._12_4_ = 0;
    local_58.href = "http://www.w3.org/XML/1998/namespace";
    xmlUnsetNsProp(copy,&local_58,"base");
  }
  else {
    iVar1 = xmlStrlen(local_68);
    if ((iVar1 < 0x7d1) && (iVar1 = xmlStrlen(targetBase), iVar1 < 0x7d1)) {
      iVar1 = xmlBuildRelativeURISafe(local_68,targetBase,&local_60);
      if (-1 < iVar1) {
        if (local_60 == (xmlChar *)0x0) {
          xmlXIncludeErr(ctxt,cur,0x645,"Building relative URI failed: %s\n",local_68);
          goto LAB_001b7d97;
        }
        goto LAB_001b7de9;
      }
    }
    else {
      local_60 = xmlStrdup(local_68);
      if (local_60 == (xmlChar *)0x0) {
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
        goto LAB_001b7d97;
      }
LAB_001b7de9:
      pxVar2 = xmlStrchr(local_60,'/');
      if (pxVar2 == (xmlChar *)0x0) goto LAB_001b7d6a;
      iVar1 = xmlNodeSetBase(copy,local_60);
      if (-1 < iVar1) goto LAB_001b7d97;
    }
    xmlXIncludeErrMemory(ctxt);
  }
LAB_001b7d97:
  (*xmlFree)(local_68);
  (*xmlFree)(local_60);
  return;
}

Assistant:

static void
xmlXIncludeBaseFixup(xmlXIncludeCtxtPtr ctxt, xmlNodePtr cur, xmlNodePtr copy,
                     const xmlChar *targetBase) {
    xmlChar *base = NULL;
    xmlChar *relBase = NULL;
    xmlNs ns;
    int res;

    if (cur->type != XML_ELEMENT_NODE)
        return;

    if (xmlNodeGetBaseSafe(cur->doc, cur, &base) < 0)
        xmlXIncludeErrMemory(ctxt);

    if ((base != NULL) && !xmlStrEqual(base, targetBase)) {
        if ((xmlStrlen(base) > XML_MAX_URI_LENGTH) ||
            (xmlStrlen(targetBase) > XML_MAX_URI_LENGTH)) {
            relBase = xmlStrdup(base);
            if (relBase == NULL) {
                xmlXIncludeErrMemory(ctxt);
                goto done;
            }
        } else if (xmlBuildRelativeURISafe(base, targetBase, &relBase) < 0) {
            xmlXIncludeErrMemory(ctxt);
            goto done;
        }
        if (relBase == NULL) {
            xmlXIncludeErr(ctxt, cur,
                    XML_XINCLUDE_HREF_URI,
                    "Building relative URI failed: %s\n",
                    base);
            goto done;
        }

        /*
         * If the new base doesn't contain a slash, it can be omitted.
         */
        if (xmlStrchr(relBase, '/') != NULL) {
            res = xmlNodeSetBase(copy, relBase);
            if (res < 0)
                xmlXIncludeErrMemory(ctxt);
            goto done;
        }
    }

    /*
     * Delete existing xml:base if bases are equal
     */
    memset(&ns, 0, sizeof(ns));
    ns.href = XML_XML_NAMESPACE;
    xmlUnsetNsProp(copy, &ns, BAD_CAST "base");

done:
    xmlFree(base);
    xmlFree(relBase);
}